

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  ZSTD_CCtx_params local_c0;
  
  auVar1 = vpaddd_avx((undefined1  [16])params.cParams._0_16_,_DAT_001b5ab0);
  auVar2 = vpminud_avx(auVar1,_DAT_001b5ac0);
  auVar1 = vpcmpeqd_avx(auVar1,auVar2);
  sVar3 = 0xffffffffffffffd6;
  if (((((((auVar1 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
          (auVar1 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar1 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar1[0xf]) &&
       (params.cParams.minMatch - 3 < 5)) && (params.cParams.targetLength < 0x20001)) &&
     (params.cParams.strategy - ZSTD_fast < 9)) {
    ZSTD_assignParamsToCCtxParams(&local_c0,&cctx->requestedParams,&params);
    sVar3 = ZSTD_compress_advanced_internal
                      (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,&local_c0);
  }
  return sVar3;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams));
    return ZSTD_compress_internal(cctx,
                                  dst, dstCapacity,
                                  src, srcSize,
                                  dict, dictSize,
                                  &params);
}